

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

int __thiscall embree::Scene::bind(Scene *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Device *pDVar1;
  Ref<embree::Geometry> *pRVar2;
  float **ppfVar3;
  uint *ptr;
  Geometry *pGVar4;
  bool bVar5;
  int iVar6;
  size_t i;
  undefined8 *puVar7;
  undefined4 extraout_var;
  ulong uVar8;
  undefined4 extraout_var_00;
  uint *puVar9;
  size_t i_1;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  allocator local_61;
  Lock<embree::MutexSys> lock;
  string local_50 [32];
  
  lock.mutex = &this->geometriesMutex;
  lock.locked = true;
  MutexSys::lock(lock.mutex);
  if (__fd == -1) {
    __fd = IDPool<unsigned_int,_4294967294UL>::allocate(&this->id_pool);
    if (__fd == 0xffffffff) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_50,"too many geometries inside scene",&local_61);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar7 + 2),local_50);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else {
    bVar5 = IDPool<unsigned_int,_4294967294UL>::add(&this->id_pool,__fd);
    if (!bVar5) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_50,"invalid geometry ID provided",&local_61);
      *puVar7 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar7 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar7 + 2),local_50);
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  uVar14 = (ulong)(uint)__fd;
  uVar10 = (this->geometries).size_active;
  if (uVar14 < uVar10) goto LAB_001ac0ea;
  uVar13 = (ulong)(__fd + 1);
  uVar8 = (this->geometries).size_alloced;
  if (uVar8 < uVar13) {
    uVar12 = uVar8;
    uVar11 = uVar13;
    if (uVar8 != 0) {
      for (; uVar11 = uVar12, uVar12 < uVar13; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
      }
    }
    if (uVar8 == uVar11) goto LAB_001abf54;
    pDVar1 = (this->geometries).alloc.device;
    pRVar2 = (this->geometries).items;
    iVar6 = (*(pDVar1->super_State).super_RefCount._vptr_RefCount[8])(pDVar1,uVar11 * 8,8);
    (this->geometries).items = (Ref<embree::Geometry> *)CONCAT44(extraout_var,iVar6);
    for (uVar10 = 0; uVar8 = (this->geometries).size_active, uVar10 < uVar8; uVar10 = uVar10 + 1) {
      (this->geometries).items[uVar10].ptr = pRVar2[uVar10].ptr;
      pRVar2[uVar10].ptr = (Geometry *)0x0;
    }
    for (; uVar8 < uVar13; uVar8 = uVar8 + 1) {
      (this->geometries).items[uVar8].ptr = (Geometry *)0x0;
    }
    pDVar1 = (this->geometries).alloc.device;
    if (pDVar1 != (Device *)0x0) {
      (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,pRVar2);
    }
    (this->geometries).size_active = uVar13;
    (this->geometries).size_alloced = uVar11;
  }
  else {
LAB_001abf54:
    for (; uVar10 < uVar13; uVar10 = uVar10 + 1) {
      (this->geometries).items[uVar10].ptr = (Geometry *)0x0;
    }
    (this->geometries).size_active = uVar13;
  }
  uVar10 = (this->vertices).size_alloced;
  uVar8 = uVar10;
  if ((uVar10 < uVar13) && (uVar12 = uVar10, uVar8 = uVar13, uVar10 != 0)) {
    for (; uVar8 = uVar12, uVar12 < uVar13; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
    }
  }
  if (uVar13 < (this->vertices).size_active) {
    (this->vertices).size_active = uVar13;
  }
  if (uVar10 == uVar8) {
    (this->vertices).size_active = uVar13;
  }
  else {
    pDVar1 = (this->vertices).alloc.device;
    ppfVar3 = (this->vertices).items;
    iVar6 = (*(pDVar1->super_State).super_RefCount._vptr_RefCount[8])(pDVar1,uVar8 * 8,8,3);
    (this->vertices).items = (float **)CONCAT44(extraout_var_00,iVar6);
    for (uVar10 = 0; uVar10 < (this->vertices).size_active; uVar10 = uVar10 + 1) {
      (this->vertices).items[uVar10] = ppfVar3[uVar10];
    }
    pDVar1 = (this->vertices).alloc.device;
    if (pDVar1 != (Device *)0x0) {
      (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,ppfVar3);
    }
    (this->vertices).size_active = uVar13;
    (this->vertices).size_alloced = uVar8;
  }
  uVar10 = (this->geometryModCounters_).size_alloced;
  uVar8 = uVar10;
  if ((uVar10 < uVar13) && (uVar12 = uVar10, uVar8 = uVar13, uVar10 != 0)) {
    for (; uVar8 = uVar12, uVar12 < uVar13; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
    }
  }
  if (uVar13 < (this->geometryModCounters_).size_active) {
    (this->geometryModCounters_).size_active = uVar13;
  }
  if (uVar10 == uVar8) {
    (this->geometryModCounters_).size_active = uVar13;
  }
  else {
    ptr = (this->geometryModCounters_).items;
    puVar9 = (uint *)alignedMalloc(uVar8 * 4,4);
    (this->geometryModCounters_).items = puVar9;
    for (uVar10 = 0; uVar10 < (this->geometryModCounters_).size_active; uVar10 = uVar10 + 1) {
      (this->geometryModCounters_).items[uVar10] = ptr[uVar10];
    }
    alignedFree(ptr);
    (this->geometryModCounters_).size_active = uVar13;
    (this->geometryModCounters_).size_alloced = uVar8;
  }
LAB_001ac0ea:
  pRVar2 = (this->geometries).items;
  if (*(long **)__addr != (long *)0x0) {
    (**(code **)(**(long **)__addr + 0x10))();
  }
  pGVar4 = pRVar2[uVar14].ptr;
  if (pGVar4 != (Geometry *)0x0) {
    (*(pGVar4->super_RefCount)._vptr_RefCount[3])();
  }
  pRVar2[uVar14].ptr = *(Geometry **)__addr;
  (this->geometryModCounters_).items[uVar14] = 0;
  if ((*(byte *)(*(long *)__addr + 0x3e) & 0x20) != 0) {
    this->modified = true;
  }
  Lock<embree::MutexSys>::~Lock(&lock);
  return __fd;
}

Assistant:

unsigned Scene::bind(unsigned geomID, Ref<Geometry> geometry) 
  {
    Lock<MutexSys> lock(geometriesMutex);
    if (geomID == RTC_INVALID_GEOMETRY_ID) {
      geomID = id_pool.allocate();
      if (geomID == RTC_INVALID_GEOMETRY_ID)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"too many geometries inside scene");
    }
    else
    {
      if (!id_pool.add(geomID))
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid geometry ID provided");
    }
    if (geomID >= geometries.size()) {
      geometries.resize(geomID+1);
      vertices.resize(geomID+1);
      geometryModCounters_.resize(geomID+1);
    }
    geometries[geomID] = geometry;
    geometryModCounters_[geomID] = 0;
    if (geometry->isEnabled()) {
      setModified ();
    }
    return geomID;
  }